

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

pair<bool,_std::pair<const_char_*,_unsigned_long>_> * __thiscall
Fixpp::impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
          (pair<bool,_std::pair<const_char_*,_unsigned_long>_> *__return_storage_ptr__,impl *this,
          StreamCursor *cursor)

{
  bool bVar1;
  bool local_b9;
  pair<const_char_*,_unsigned_long> local_b8;
  bool local_a1;
  undefined1 local_a0 [8];
  pair<const_char_*,_unsigned_long> ret;
  bool local_79;
  pair<const_char_*,_unsigned_long> local_78;
  bool local_65 [5];
  pair<const_char_*,_unsigned_long> local_60;
  bool local_4d [17];
  int local_3c;
  undefined1 local_38 [4];
  int tag;
  Revert revert;
  StreamCursor *cursor_local;
  
  revert._32_8_ = this;
  StreamCursor::Revert::Revert((Revert *)local_38,(StreamCursor *)this);
  bVar1 = match_int_fast(&local_3c,(StreamCursor *)revert._32_8_);
  if (bVar1) {
    if (local_3c == 8) {
      bVar1 = match_literal_fast('=',(StreamCursor *)revert._32_8_);
      if (bVar1) {
        std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long,_true>
                  ((pair<const_char_*,_unsigned_long> *)local_a0);
        bVar1 = TagMatcher<Fixpp::Type::String>::matchValue
                          ((Return *)local_a0,(StreamCursor *)revert._32_8_);
        if (bVar1) {
          StreamCursor::Revert::ignore((Revert *)local_38);
          local_b9 = true;
          std::make_pair<bool,std::pair<char_const*,unsigned_long>&>
                    (__return_storage_ptr__,&local_b9,(pair<const_char_*,_unsigned_long> *)local_a0)
          ;
        }
        else {
          local_a1 = false;
          std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long,_true>(&local_b8)
          ;
          std::make_pair<bool,std::pair<char_const*,unsigned_long>>
                    (__return_storage_ptr__,&local_a1,&local_b8);
        }
      }
      else {
        local_79 = false;
        std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long,_true>
                  ((pair<const_char_*,_unsigned_long> *)&ret.second);
        std::make_pair<bool,std::pair<char_const*,unsigned_long>>
                  (__return_storage_ptr__,&local_79,(pair<const_char_*,_unsigned_long> *)&ret.second
                  );
      }
    }
    else {
      local_65[0] = false;
      std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long,_true>(&local_78);
      std::make_pair<bool,std::pair<char_const*,unsigned_long>>
                (__return_storage_ptr__,local_65,&local_78);
    }
  }
  else {
    local_4d[0] = false;
    std::pair<const_char_*,_unsigned_long>::pair<const_char_*,_unsigned_long,_true>(&local_60);
    std::make_pair<bool,std::pair<char_const*,unsigned_long>>
              (__return_storage_ptr__,local_4d,&local_60);
  }
  local_65[1] = true;
  local_65[2] = false;
  local_65[3] = false;
  local_65[4] = false;
  StreamCursor::Revert::~Revert((Revert *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }